

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_index.cpp
# Opt level: O3

bool __thiscall
MeCab::EncoderFeatureIndex::reopen
          (EncoderFeatureIndex *this,char *filename,char *dic_charset,
          vector<double,_std::allocator<double>_> *alpha,Param *param)

{
  pointer pdVar1;
  size_t sVar2;
  iterator __position;
  char *pcVar3;
  vector<double,_std::allocator<double>_> *pvVar4;
  EncoderFeatureIndex *pEVar5;
  bool bVar6;
  int iVar7;
  uint uVar8;
  char *__s;
  long *plVar9;
  size_t sVar10;
  char *pcVar11;
  ostream *poVar12;
  ulong uVar13;
  char **ppcVar14;
  char *pcVar15;
  long lVar16;
  char *pcVar17;
  string model_charset;
  Iconv iconv;
  string feature;
  char *column [8];
  ifstream ifs;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  local_318;
  char *local_2f0;
  char *local_2e8;
  char local_2e0 [20];
  uint local_2cc;
  vector<double,_std::allocator<double>_> *local_2c8;
  EncoderFeatureIndex *local_2c0;
  Iconv local_2b8;
  char *local_2a8;
  Param *local_2a0;
  string local_298;
  char *local_278 [8];
  long local_238 [4];
  uint auStack_218 [122];
  
  (*(this->super_FeatureIndex)._vptr_FeatureIndex[2])();
  std::ifstream::ifstream(local_238,filename,_S_in);
  lVar16 = *(long *)(local_238[0] + -0x18);
  uVar8 = *(uint *)((long)auStack_218 + lVar16);
  if ((uVar8 & 5) == 0) {
    local_2cc = uVar8;
    local_2c8 = alpha;
    local_2c0 = this;
    local_2a8 = dic_charset;
    local_2a0 = param;
    __s = (char *)operator_new__(0x2000);
    local_2f0 = local_2e0;
    local_2e8 = (char *)0x0;
    local_2e0[0] = '\0';
    while( true ) {
      std::ios::widen((char)&local_318 + (char)lVar16 + -0x20);
      plVar9 = (long *)std::istream::getline((char *)local_238,(long)__s,'\0');
      pcVar17 = local_2a8;
      pvVar4 = local_2c8;
      if (((*(byte *)((long)plVar9 + *(long *)(*plVar9 + -0x18) + 0x20) & 5) != 0) || (*__s == '\0')
         ) break;
      sVar10 = strlen(__s);
      pcVar11 = __s + sVar10;
      ppcVar14 = local_278;
      uVar13 = 0;
      pcVar17 = __s;
      do {
        pcVar3 = pcVar17;
        if (1 < uVar13) break;
        for (; (pcVar15 = pcVar11, pcVar3 != pcVar11 && (pcVar15 = pcVar3, *pcVar3 != ':'));
            pcVar3 = pcVar3 + 1) {
        }
        *pcVar15 = '\0';
        if (*pcVar17 != '\0') {
          *ppcVar14 = pcVar17;
          ppcVar14 = ppcVar14 + 1;
          uVar13 = uVar13 + 1;
        }
        pcVar17 = pcVar15 + 1;
      } while (pcVar15 != pcVar11);
      if (uVar13 != 2) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,
                   "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/feature_index.cpp"
                   ,0x73);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
        poVar12 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x27b);
        std::__ostream_insert<char,std::char_traits<char>>(poVar12,") [",3);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar12,"tokenize2(buf.get(), \":\", column, 2) == 2",0x29);
        std::__ostream_insert<char,std::char_traits<char>>(poVar12,"] ",2);
        std::__ostream_insert<char,std::char_traits<char>>(poVar12,"format error: ",0xe);
        sVar10 = strlen(__s);
        std::__ostream_insert<char,std::char_traits<char>>(poVar12,__s,sVar10);
        die::~die((die *)&local_318);
      }
      pcVar17 = local_278[0];
      std::__cxx11::string::string((string *)&local_318,local_278[0],(allocator *)&local_298);
      iVar7 = std::__cxx11::string::compare((char *)&local_318);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_318.first._M_dataplus._M_p != &local_318.first.field_2) {
        operator_delete(local_318.first._M_dataplus._M_p);
      }
      pcVar3 = local_278[1];
      pcVar11 = local_2e8;
      if (iVar7 == 0) {
        pcVar17 = local_278[1] + 1;
        strlen(pcVar17);
        std::__cxx11::string::_M_replace((ulong)&local_2f0,0,pcVar11,(ulong)pcVar17);
      }
      else {
        pcVar11 = local_278[1] + 1;
        local_318.first._M_dataplus._M_p = (pointer)&local_318.first.field_2;
        sVar10 = strlen(pcVar11);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_318,pcVar11,pcVar3 + sVar10 + 1);
        Param::set<std::__cxx11::string>(local_2a0,pcVar17,&local_318.first,true);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_318.first._M_dataplus._M_p != &local_318.first.field_2) {
          operator_delete(local_318.first._M_dataplus._M_p);
        }
      }
      lVar16 = *(long *)(local_238[0] + -0x18);
    }
    if (local_2a8 == (char *)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,
                 "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/feature_index.cpp"
                 ,0x73);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
      poVar12 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x284);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,") [",3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,"dic_charset",0xb);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,"] ",2);
      die::~die((die *)&local_318);
    }
    if (local_2e8 == (char *)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,
                 "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/feature_index.cpp"
                 ,0x73);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
      poVar12 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x285);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,") [",3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,"!model_charset.empty()",0x16);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,"] ",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,"charset is empty",0x10);
      die::~die((die *)&local_318);
    }
    Iconv::Iconv(&local_2b8);
    iVar7 = Iconv::open(&local_2b8,local_2f0,(int)pcVar17);
    if ((char)iVar7 == '\0') {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,
                 "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/feature_index.cpp"
                 ,0x73);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
      poVar12 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x288);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,") [",3);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar12,"iconv.open(model_charset.c_str(), dic_charset)",0x2e);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,"] ",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,"cannot create model from=",0x19);
      poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar12,local_2f0,(long)local_2e8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12," to=",4);
      if (pcVar17 == (char *)0x0) {
        std::ios::clear((int)poVar12 + (int)*(undefined8 *)(*(long *)poVar12 + -0x18));
      }
      else {
        sVar10 = strlen(pcVar17);
        std::__ostream_insert<char,std::char_traits<char>>(poVar12,pcVar17,sVar10);
      }
      die::~die((die *)&local_318);
    }
    pEVar5 = local_2c0;
    pdVar1 = (pvVar4->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((pvVar4->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
        super__Vector_impl_data._M_finish != pdVar1) {
      (pvVar4->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_finish = pdVar1;
    }
    if ((local_2c0->super_FeatureIndex).maxid_ != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,
                 "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/feature_index.cpp"
                 ,0x73);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
      poVar12 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x28d);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,") [",3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,"maxid_ == 0",0xb);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,"] ",2);
      die::~die((die *)&local_318);
    }
    if ((pEVar5->dic_)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,
                 "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/feature_index.cpp"
                 ,0x73);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
      poVar12 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x28e);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,") [",3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,"dic_.empty()",0xc);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,"] ",2);
      die::~die((die *)&local_318);
    }
    while( true ) {
      std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) + (char)local_238);
      plVar9 = (long *)std::istream::getline((char *)local_238,(long)__s,'\0');
      if ((*(byte *)((long)plVar9 + *(long *)(*plVar9 + -0x18) + 0x20) & 5) != 0) break;
      sVar10 = strlen(__s);
      pcVar11 = __s + sVar10;
      ppcVar14 = local_278;
      uVar13 = 0;
      pcVar17 = __s;
      do {
        pcVar3 = pcVar17;
        if (1 < uVar13) break;
        for (; (pcVar15 = pcVar11, pcVar3 != pcVar11 && (pcVar15 = pcVar3, *pcVar3 != '\t'));
            pcVar3 = pcVar3 + 1) {
        }
        *pcVar15 = '\0';
        if (*pcVar17 != '\0') {
          *ppcVar14 = pcVar17;
          ppcVar14 = ppcVar14 + 1;
          uVar13 = uVar13 + 1;
        }
        pcVar17 = pcVar15 + 1;
      } while (pcVar15 != pcVar11);
      if (uVar13 != 2) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,
                   "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/feature_index.cpp"
                   ,0x73);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
        poVar12 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x291);
        std::__ostream_insert<char,std::char_traits<char>>(poVar12,") [",3);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar12,"tokenize2(buf.get(), \"\\t\", column, 2) == 2",0x2a);
        std::__ostream_insert<char,std::char_traits<char>>(poVar12,"] ",2);
        std::__ostream_insert<char,std::char_traits<char>>(poVar12,"format error: ",0xe);
        sVar10 = strlen(__s);
        std::__ostream_insert<char,std::char_traits<char>>(poVar12,__s,sVar10);
        die::~die((die *)&local_318);
      }
      std::__cxx11::string::string((string *)&local_298,local_278[1],(allocator *)&local_318);
      bVar6 = Iconv::convert(&local_2b8,&local_298);
      if (!bVar6) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,
                   "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/feature_index.cpp"
                   ,0x73);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
        poVar12 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x294);
        std::__ostream_insert<char,std::char_traits<char>>(poVar12,") [",3);
        std::__ostream_insert<char,std::char_traits<char>>(poVar12,"iconv.convert(&feature)",0x17);
        std::__ostream_insert<char,std::char_traits<char>>(poVar12,"] ",2);
        die::~die((die *)&local_318);
      }
      sVar2 = (local_2c0->super_FeatureIndex).maxid_;
      (local_2c0->super_FeatureIndex).maxid_ = sVar2 + 1;
      local_318.first._M_dataplus._M_p = (pointer)&local_318.first.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_318,local_298._M_dataplus._M_p,
                 local_298._M_dataplus._M_p + local_298._M_string_length);
      local_318.second = sVar2;
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::_Select1st<std::pair<std::__cxx11::string_const,int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
      ::_M_emplace_unique<std::pair<std::__cxx11::string,unsigned_long>>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::_Select1st<std::pair<std::__cxx11::string_const,int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
                  *)&pEVar5->dic_,&local_318);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_318.first._M_dataplus._M_p != &local_318.first.field_2) {
        operator_delete(local_318.first._M_dataplus._M_p);
      }
      local_318.first._M_dataplus._M_p = (pointer)atof(local_278[0]);
      __position._M_current =
           (local_2c8->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (local_2c8->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                  (local_2c8,__position,(double *)&local_318);
      }
      else {
        *__position._M_current = (double)local_318.first._M_dataplus._M_p;
        (local_2c8->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298._M_dataplus._M_p != &local_298.field_2) {
        operator_delete(local_298._M_dataplus._M_p);
      }
    }
    Iconv::~Iconv(&local_2b8);
    if (local_2f0 != local_2e0) {
      operator_delete(local_2f0);
    }
    operator_delete__(__s);
    uVar8 = local_2cc;
  }
  std::ifstream::~ifstream(local_238);
  return (uVar8 & 5) == 0;
}

Assistant:

bool EncoderFeatureIndex::reopen(const char *filename,
                                 const char *dic_charset,
                                 std::vector<double> *alpha,
                                 Param *param) {
  close();
  std::ifstream ifs(WPATH(filename));
  if (!ifs) {
    return false;
  }

  scoped_fixed_array<char, BUF_SIZE> buf;
  char *column[8];

  std::string model_charset;

  while (ifs.getline(buf.get(), buf.size())) {
    if (std::strlen(buf.get()) == 0) {
      break;
    }
    CHECK_DIE(tokenize2(buf.get(), ":", column, 2) == 2)
        << "format error: " << buf.get();
    if (std::string(column[0]) == "charset") {
      model_charset = column[1] + 1;
    } else {
      param->set<std::string>(column[0], column[1] + 1, true);
    }
  }

  CHECK_DIE(dic_charset);
  CHECK_DIE(!model_charset.empty()) << "charset is empty";

  Iconv iconv;
  CHECK_DIE(iconv.open(model_charset.c_str(), dic_charset))
      << "cannot create model from=" << model_charset
      << " to=" << dic_charset;

  alpha->clear();
  CHECK_DIE(maxid_ == 0);
  CHECK_DIE(dic_.empty());

  while (ifs.getline(buf.get(), buf.size())) {
    CHECK_DIE(tokenize2(buf.get(), "\t", column, 2) == 2)
        << "format error: " << buf.get();
    std::string feature = column[1];
    CHECK_DIE(iconv.convert(&feature));
    dic_.insert(std::make_pair(feature, maxid_++));
    alpha->push_back(atof(column[0]));
  }

  return true;
}